

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *__s;
  int iVar8;
  int *piVar9;
  int *piVar10;
  bool bVar11;
  int local_44;
  
  piVar9 = vArr1->pArray + 1;
  piVar10 = vArr2->pArray + 1;
  iVar8 = vArr1->nSize;
  piVar1 = vArr1->pArray + iVar8;
  iVar6 = vArr2->nSize;
  piVar2 = vArr2->pArray + iVar6;
  vCubeFree->nSize = 0;
  if (iVar6 < 2 || (long)iVar8 < 2) {
    iVar6 = 1;
    local_44 = 0;
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    iVar6 = 1;
    local_44 = 0;
    do {
      iVar7 = *piVar9;
      iVar3 = *piVar10;
      if (iVar7 == iVar3) {
        piVar9 = piVar9 + 1;
        piVar10 = piVar10 + 1;
        local_44 = local_44 + 1;
      }
      else {
        if (iVar7 < iVar3) {
          if (iVar7 < 0) goto LAB_0025af72;
          piVar9 = piVar9 + 1;
          iVar7 = iVar8 + iVar7 * 2;
        }
        else {
          if (iVar3 < 0) goto LAB_0025af72;
          piVar10 = piVar10 + 1;
          bVar11 = vCubeFree->nSize == 0;
          if (bVar11) {
            iVar6 = 0;
          }
          if (bVar11) {
            iVar8 = 1;
          }
          iVar7 = iVar6 + iVar3 * 2;
        }
        Vec_IntPush(vCubeFree,iVar7);
      }
    } while ((piVar9 < piVar1) && (piVar10 < piVar2));
  }
  for (; piVar9 < piVar1; piVar9 = piVar9 + 1) {
    if (*piVar9 < 0) goto LAB_0025af72;
    Vec_IntPush(vCubeFree,iVar8 + *piVar9 * 2);
  }
  for (; piVar10 < piVar2; piVar10 = piVar10 + 1) {
    if (*piVar10 < 0) {
LAB_0025af72:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10b,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(vCubeFree,iVar6 + *piVar10 * 2);
  }
  iVar8 = vCubeFree->nSize;
  if (iVar8 == 2) {
    uVar4 = *vCubeFree->pArray;
    if (((int)uVar4 < 0) || (uVar5 = vCubeFree->pArray[1], (int)uVar5 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    if (((uVar5 ^ uVar4) < 4) && (*fWarning == 0)) {
      puts(
          "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies."
          );
      *fWarning = 1;
    }
  }
  else {
    if (iVar8 == 1) {
      __s = "The SOP has contained cubes.";
    }
    else {
      if (iVar8 != 0) goto LAB_0025aefe;
      __s = "The SOP has duplicated cubes.";
    }
    puts(__s);
  }
  iVar8 = vCubeFree->nSize;
LAB_0025aefe:
  if (iVar8 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (-1 < *vCubeFree->pArray) {
    if ((*vCubeFree->pArray & 1U) == 0) {
      return local_44;
    }
    __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x29d,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10d,"int Abc_LitIsCompl(int)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vArr1->pArray + 1;  // skip variable ID
    int * pBeg2 = vArr2->pArray + 1;  // skip variable ID
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        printf( "The SOP has contained cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 2 && Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 0))) == Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 1))) && !*fWarning )
        printf( "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies.\n" ), *fWarning = 1;
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}